

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_color_fv(float *c,nk_color in)

{
  undefined1 auVar1 [13];
  
  auVar1[0xc] = in.a;
  auVar1._0_12_ = ZEXT712(0);
  *c = (float)((uint)in & 0xff) * 0.003921569;
  c[1] = (float)((uint)in >> 8 & 0xff) * 0.003921569;
  c[2] = (float)(int)CONCAT32(auVar1._10_3_,(ushort)in.b) * 0.003921569;
  c[3] = (float)(uint3)(auVar1._10_3_ >> 0x10) * 0.003921569;
  return;
}

Assistant:

NK_API void
nk_color_fv(float *c, struct nk_color in)
{
    nk_color_f(&c[0], &c[1], &c[2], &c[3], in);
}